

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoStore<v128,v128>(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  v128 val_00;
  bool bVar2;
  u32 uVar3;
  RefVec *this_00;
  const_reference pvVar4;
  Memory *pMVar5;
  ulong uVar6;
  string local_a0;
  Ptr local_80;
  undefined8 local_68;
  uint8_t local_60 [8];
  Enum local_58;
  u32 local_54;
  undefined1 auStack_50 [4];
  u32 offset;
  v128 val;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  val.v._8_8_ = pvVar4->index;
  RefPtr<wabt::interp::Memory>::RefPtr
            ((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,(Ref)val.v._8_8_);
  _auStack_50 = Pop<v128>(this);
  local_54 = Pop<unsigned_int>(this);
  pMVar5 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  val_00.v = _auStack_50;
  local_68 = _auStack_50;
  local_60[0] = val.v[0];
  local_60[1] = val.v[1];
  local_60[2] = val.v[2];
  local_60[3] = val.v[3];
  local_60[4] = val.v[4];
  local_60[5] = val.v[5];
  local_60[6] = val.v[6];
  local_60[7] = val.v[7];
  _auStack_50 = val_00.v;
  local_58 = (Enum)Memory::Store<v128>(pMVar5,local_54,instr.field_2.imm_u32x2.snd,val_00);
  bVar2 = Failed((Result)local_58);
  if (bVar2) {
    pSVar1 = this->store_;
    uVar6 = (ulong)local_54;
    pMVar5 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
    uVar3 = Memory::ByteSize(pMVar5);
    StringPrintf_abi_cxx11_
              (&local_a0,"out of bounds memory access: access at %lu+%zd >= max value %u",
               uVar6 + instr.field_2.imm_u32x2.snd,0x10,(ulong)uVar3);
    Trap::New(&local_80,pSVar1,&local_a0,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_80);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoStore(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V val = static_cast<V>(Pop<T>());
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %u",
                       u64{offset} + instr.imm_u32x2.snd, sizeof(V),
                       memory->ByteSize()));
  return RunResult::Ok;
}